

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

void ImGui::Scrollbar(ImGuiAxis axis)

{
  float *p_scroll_v;
  ImGuiWindow *this;
  undefined1 auVar1 [16];
  ImGuiID id;
  char *str;
  int rounding_corners;
  bool bVar2;
  undefined1 in_ZMM0 [64];
  undefined1 auVar3 [64];
  undefined1 in_ZMM1 [64];
  undefined1 auVar5 [64];
  ImRect IVar7;
  ImRect bb;
  ImRect local_28;
  undefined1 auVar4 [56];
  undefined1 auVar6 [56];
  
  auVar6 = in_ZMM1._8_56_;
  auVar4 = in_ZMM0._8_56_;
  this = GImGui->CurrentWindow;
  str = "#SCROLLY";
  if (axis == ImGuiAxis_X) {
    str = "#SCROLLX";
  }
  id = ImGuiWindow::GetIDNoKeepAlive(this,str,(char *)0x0);
  KeepAliveID(id);
  IVar7 = GetWindowScrollbarRect(this,axis);
  auVar5._0_8_ = IVar7.Max;
  auVar5._8_56_ = auVar6;
  auVar3._0_8_ = IVar7.Min;
  auVar3._8_56_ = auVar4;
  local_28 = (ImRect)vmovlhps_avx(auVar3._0_16_,auVar5._0_16_);
  if (axis == ImGuiAxis_X) {
    rounding_corners = (this->ScrollbarY ^ 1) * 8 + 4;
  }
  else {
    bVar2 = (this->Flags & 0x401U) == 1;
    rounding_corners = bVar2 + 8 + (uint)bVar2;
    if (this->ScrollbarX != false) {
      rounding_corners = (uint)bVar2 * 2;
    }
  }
  p_scroll_v = &(this->Scroll).x + axis;
  auVar1 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40000000),0),ZEXT416((uint)p_scroll_v[-7]),
                           ZEXT416((uint)p_scroll_v[-0xb]));
  ScrollbarEx(&local_28,id,axis,p_scroll_v,p_scroll_v[0x77] - p_scroll_v[0x75],auVar1._0_4_,
              rounding_corners);
  return;
}

Assistant:

void ImGui::Scrollbar(ImGuiAxis axis)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    const ImGuiID id = GetWindowScrollbarID(window, axis);
    KeepAliveID(id);

    // Calculate scrollbar bounding box
    ImRect bb = GetWindowScrollbarRect(window, axis);
    ImDrawCornerFlags rounding_corners = 0;
    if (axis == ImGuiAxis_X)
    {
        rounding_corners |= ImDrawCornerFlags_BotLeft;
        if (!window->ScrollbarY)
            rounding_corners |= ImDrawCornerFlags_BotRight;
    }
    else
    {
        if ((window->Flags & ImGuiWindowFlags_NoTitleBar) && !(window->Flags & ImGuiWindowFlags_MenuBar))
            rounding_corners |= ImDrawCornerFlags_TopRight;
        if (!window->ScrollbarX)
            rounding_corners |= ImDrawCornerFlags_BotRight;
    }
    float size_avail = window->InnerRect.Max[axis] - window->InnerRect.Min[axis];
    float size_contents = window->ContentSize[axis] + window->WindowPadding[axis] * 2.0f;
    ScrollbarEx(bb, id, axis, &window->Scroll[axis], size_avail, size_contents, rounding_corners);
}